

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSender.hpp
# Opt level: O2

void __thiscall
Statsd::UDPSender::UDPSender
          (UDPSender *this,string *host,uint16_t port,uint64_t batchsize,uint64_t sendInterval)

{
  bool bVar1;
  thread local_30;
  anon_class_8_1_8991fb9c_for__M_head_impl local_28;
  
  (this->m_mustExit)._M_base._M_i = false;
  std::__cxx11::string::string((string *)&this->m_host,(string *)host);
  this->m_port = port;
  this->m_socket = -1;
  this->m_batchsize = batchsize;
  this->m_sendInterval = sendInterval;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(&(this->m_batchingMessageQueue).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  (this->m_batchingMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_batchingThread)._M_id._M_thread = 0;
  *(undefined8 *)((long)&(this->m_batchingMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_batchingMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_batchingMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_batchingMutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)&(this->m_errorMessage).field_2;
  (this->m_errorMessage)._M_string_length = 0;
  (this->m_errorMessage).field_2._M_local_buf[0] = '\0';
  if ((this->m_host)._M_string_length != 0) {
    bVar1 = initialize(this);
    if (((bVar1) && (this->m_batchsize != 0)) && (this->m_sendInterval != 0)) {
      local_28.this = this;
      std::thread::
      thread<Statsd::UDPSender::UDPSender(std::__cxx11::string_const&,unsigned_short,unsigned_long,unsigned_long)::_lambda()_1_,,void>
                (&local_30,&local_28);
      std::thread::operator=(&this->m_batchingThread,&local_30);
      std::thread::~thread(&local_30);
    }
  }
  return;
}

Assistant:

inline UDPSender::UDPSender(const std::string& host,
                            const uint16_t port,
                            const uint64_t batchsize,
                            const uint64_t sendInterval) noexcept
    : m_host(host), m_port(port), m_batchsize(batchsize), m_sendInterval(sendInterval) {
    // Initialize the socket
    if (m_host.empty() || !initialize()) {
        return;
    }

    // If batching is on, use a dedicated thread to send after the wait time is reached
    if (m_batchsize != 0 && m_sendInterval > 0) {
        // Define the batching thread
        m_batchingThread = std::thread([this] {
            // TODO: this will drop unsent stats, should we send all the unsent stats before we exit?
            while (!m_mustExit.load(std::memory_order_acquire)) {
                std::deque<std::string> stagedMessageQueue;

                std::unique_lock<std::mutex> batchingLock(m_batchingMutex);
                m_batchingMessageQueue.swap(stagedMessageQueue);
                batchingLock.unlock();

                // Flush the queue
                while (!stagedMessageQueue.empty()) {
                    sendToDaemon(stagedMessageQueue.front());
                    stagedMessageQueue.pop_front();
                }

                // Wait before sending the next batch
                std::this_thread::sleep_for(std::chrono::milliseconds(m_sendInterval));
            }
        });
    }
}